

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmaincn.h
# Opt level: O0

void __thiscall
CVmMainClientConsole::client_init
          (CVmMainClientConsole *this,vm_globals *vmg,char *script_file,int script_quiet,
          char *log_file,char *cmd_log_file,char *banner_str,int more_mode)

{
  undefined4 in_ECX;
  long in_RDX;
  char *in_R8;
  CVmConsole *in_R9;
  int in_stack_000000c0;
  int in_stack_000000c4;
  char *in_stack_000000c8;
  CVmConsole *in_stack_000000d0;
  undefined4 in_stack_ffffffffffffffe0;
  
  (*(G_console_X->super_CVmConsole)._vptr_CVmConsole[4])(G_console_X,(ulong)log_file & 0xffffffff);
  if (in_RDX != 0) {
    CVmConsole::open_script_file
              (in_stack_000000d0,in_stack_000000c8,in_stack_000000c4,in_stack_000000c0);
  }
  if (in_R8 != (char *)0x0) {
    CVmConsole::open_log_file((CVmConsole *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_R8);
  }
  if (in_R9 != (CVmConsole *)0x0) {
    CVmConsole::open_command_log(in_stack_000000d0,in_stack_000000c8,in_stack_000000c4);
  }
  CVmConsole::format_text((CVmConsole *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_R8);
  if (cmd_log_file != (char *)0x0) {
    CVmConsole::format_text((CVmConsole *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_R8);
    CVmConsole::write_blank_line(in_R9);
  }
  return;
}

Assistant:

void client_init(struct vm_globals *vmg,
                     const char *script_file, int script_quiet,
                     const char *log_file,
                     const char *cmd_log_file,
                     const char *banner_str,
                     int more_mode)
    {
        /* set up for global access */
        VMGLOB_PTR(vmg);

        /* set the [More] mode as desired */
        G_console->set_more_state(more_mode);

        /* if we have a script file, set up script input on the console */
        if (script_file != 0)
        {
            G_console->open_script_file(
                vmg_ script_file, script_quiet, FALSE);
        }

        /* if we have a log file, set up logging on the console */
        if (log_file != 0)
            G_console->open_log_file(vmg_ log_file);

        /* set up command logging on the console if desired */
        if (cmd_log_file != 0)
            G_console->open_command_log(vmg_ cmd_log_file, TRUE);

        /* tell the HTML renderer that we're a T3 caller */
        G_console->format_text(vmg_ "<?T3>");

        /* show the banner on the console, if desired */
        if (banner_str != 0)
        {
            G_console->format_text(vmg_ banner_str);
            G_console->write_blank_line(vmg0_);
        }
    }